

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file.cpp
# Opt level: O2

void __thiscall cppcms::http::file::impl_data::impl_data(impl_data *this)

{
  impl::file_buffer::file_buffer(&this->fb,0);
  std::istream::istream(&this->in,(streambuf *)this);
  std::ostream::ostream(&this->out,(streambuf *)this);
  return;
}

Assistant:

impl_data() :
		in(&fb),
		out(&fb)
	{
	}